

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_3f5684::QDynamicBufferResourceRoot::~QDynamicBufferResourceRoot
          (QDynamicBufferResourceRoot *this)

{
  ~QDynamicBufferResourceRoot(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

inline ~QDynamicBufferResourceRoot() { }